

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# balance.hpp
# Opt level: O0

void Block::save(void *b_,BinaryBuffer *bb)

{
  BinaryBuffer *in_RSI;
  Bounds<int> *in_RDI;
  Block *b;
  
  diy::save<int>(in_RSI,(int *)in_RDI);
  diy::save<diy::Bounds<int>>(in_RSI,in_RDI);
  diy::save<std::vector<double,std::allocator<double>>>
            (in_RSI,(vector<double,_std::allocator<double>_> *)in_RDI);
  diy::save<unsigned_int>(in_RSI,(uint *)in_RDI);
  return;
}

Assistant:

static void save(const void* b_, diy::BinaryBuffer& bb)
    {
        const Block* b = static_cast<const Block*>(b_);

        diy::save(bb, b->gid);
        diy::save(bb, b->bounds);
        diy::save(bb, b->x);
        diy::save(bb, b->work);
    }